

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StrfTimeBindFunction<true>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  uint uVar2;
  pointer pEVar3;
  undefined8 uVar4;
  ulong uVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  string error;
  bool is_null;
  StrfTimeFormat format;
  string format_string;
  Value options_str;
  value_type *format_arg;
  uint format_idx;
  Value *in_stack_fffffffffffffd88;
  allocator *paVar6;
  StrfTimeFormat *in_stack_fffffffffffffd90;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  string *in_stack_fffffffffffffdf0;
  Expression *in_stack_fffffffffffffdf8;
  InvalidInputException *in_stack_fffffffffffffe00;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  Expression *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  bool *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  StrfTimeFormat *in_stack_fffffffffffffe98;
  string local_c8 [32];
  Value local_a8;
  undefined1 local_62;
  allocator local_61;
  string local_60 [48];
  reference local_30;
  undefined4 local_24;
  
  local_24 = 0;
  this_00._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_30 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd90);
  uVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])();
  if ((uVar2 & 1) != 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException
              ((ParameterNotResolvedException *)this_00._M_head_impl);
    __cxa_throw(uVar4,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd90);
  uVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])();
  if ((uVar2 & 1) == 0) {
    local_62 = 1;
    uVar4 = __cxa_allocate_exception(0x10);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffd90);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"strftime format must be a constant",&local_61);
    InvalidInputException::InvalidInputException<>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_62 = 0;
    __cxa_throw(uVar4,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd90);
  ExpressionExecutor::EvaluateScalar
            ((ClientContext *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f);
  Value::GetValue<std::__cxx11::string>(in_stack_fffffffffffffd88);
  StrfTimeFormat::StrfTimeFormat(in_stack_fffffffffffffd90);
  bVar1 = Value::IsNull(&local_a8);
  if (!bVar1) {
    StrTimeFormat::ParseFormatSpecifier
              ((string *)
               format.super_StrTimeFormat.numeric_width.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(StrTimeFormat *)format.super_StrTimeFormat.constant_size);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      this = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             __cxa_allocate_exception(0x10);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*(this)
      ;
      paVar6 = &local_1c9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c8,"Failed to parse format specifier %s: %s",paVar6);
      ::std::__cxx11::string::string(local_1f0,local_c8);
      ::std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffdf0,(string *)&stack0xfffffffffffffe58);
      InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                ((InvalidInputException *)in_stack_fffffffffffffe70,
                 (Expression *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      __cxa_throw(this,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  }
  make_uniq<duckdb::StrfTimeBindData,duckdb::StrfTimeFormat&,std::__cxx11::string&,bool&>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::StrfTimeBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::StrfTimeBindData,_std::default_delete<duckdb::StrfTimeBindData>_> *
             )in_stack_fffffffffffffd88);
  unique_ptr<duckdb::StrfTimeBindData,_std::default_delete<duckdb::StrfTimeBindData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::StrfTimeBindData,_std::default_delete<duckdb::StrfTimeBindData>,_true>
               *)0x11ef23c);
  StrfTimeFormat::~StrfTimeFormat(in_stack_fffffffffffffd90);
  ::std::__cxx11::string::~string(local_c8);
  Value::~Value((Value *)in_stack_fffffffffffffd90);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> StrfTimeBindFunction(ClientContext &context, ScalarFunction &bound_function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto format_idx = REVERSED ? 0U : 1U;
	auto &format_arg = arguments[format_idx];
	if (format_arg->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!format_arg->IsFoldable()) {
		throw InvalidInputException(*format_arg, "strftime format must be a constant");
	}
	Value options_str = ExpressionExecutor::EvaluateScalar(context, *format_arg);
	auto format_string = options_str.GetValue<string>();
	StrfTimeFormat format;
	bool is_null = options_str.IsNull();
	if (!is_null) {
		string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
		if (!error.empty()) {
			throw InvalidInputException(*format_arg, "Failed to parse format specifier %s: %s", format_string, error);
		}
	}
	return make_uniq<StrfTimeBindData>(format, format_string, is_null);
}